

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O1

void __thiscall APITests::test_pwm_multi_duty(APITests *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  PWM p;
  PWM local_70 [8];
  string local_68;
  double local_48;
  undefined8 uStack_40;
  
  lVar2 = 0;
  do {
    local_48 = *(double *)((long)&DAT_001170f8 + lVar2);
    uStack_40 = 0;
    GPIO::setmode(BOARD);
    GPIO::setup((this->pin_data).in_a,IN,-1);
    GPIO::setup((this->pin_data).out_a,OUT,1);
    GPIO::PWM::PWM(local_70,(this->pin_data).out_a,500);
    GPIO::PWM::start(local_48);
    iVar3 = 0;
    iVar4 = 5000;
    do {
      iVar1 = GPIO::input((this->pin_data).in_a);
      iVar3 = iVar3 + iVar1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    GPIO::PWM::stop();
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    assert::is_true((bool)(-((double)iVar3 <= ((local_48 + 5.0) * 5000.0) / 100.0) &
                           -(((local_48 + -5.0) * 5000.0) / 100.0 <= (double)iVar3) & 1),&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    GPIO::cleanup();
    GPIO::PWM::~PWM(local_70);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  return;
}

Assistant:

void test_pwm_multi_duty()
    {
        for (auto pct : {25.0, 50.0, 75.0})
        {
            GPIO::setmode(GPIO::BOARD);
            GPIO::setup(pin_data.in_a, GPIO::IN);
            GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);

            int count = 0;

            GPIO::PWM p(pin_data.out_a, 500);
            p.start(pct);
            constexpr int N = 5000;
            for (int i = 0; i < N; i++)
                count += GPIO::input(pin_data.in_a);

            p.stop();

            const auto delta = 5;
            const auto min_ct = N * (pct - delta) / 100.0;
            const auto max_ct = N * (pct + delta) / 100.0;

            assert::is_true(min_ct <= count && count <= max_ct);
            GPIO::cleanup();
        }
    }